

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> * __thiscall
pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
          (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this,
          vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *other)

{
  uchar *puVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (this != other) {
    if ((this->alloc).memoryResource == (other->alloc).memoryResource) {
      puVar1 = this->ptr;
      this->ptr = other->ptr;
      other->ptr = puVar1;
      sVar2 = this->nAlloc;
      this->nAlloc = other->nAlloc;
      other->nAlloc = sVar2;
      sVar2 = this->nStored;
      this->nStored = other->nStored;
      other->nStored = sVar2;
    }
    else {
      this->nStored = 0;
      reserve(this,other->nStored);
      uVar4 = other->nStored;
      if (uVar4 != 0) {
        uVar3 = 0;
        do {
          this->ptr[uVar3] = other->ptr[uVar3];
          uVar3 = uVar3 + 1;
          uVar4 = other->nStored;
        } while (uVar3 < uVar4);
      }
      this->nStored = uVar4;
    }
  }
  return this;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }